

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_tricks_test.cpp
# Opt level: O0

void __thiscall
SET_TRICKS_WorksSameStrict_Test::~SET_TRICKS_WorksSameStrict_Test
          (SET_TRICKS_WorksSameStrict_Test *this)

{
  SET_TRICKS_WorksSameStrict_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(SET_TRICKS, WorksSameStrict) {
    srand(123);
    set<ll> s;
    populateSet(s, 100);
    vector<ll> v;
    for(auto k : s) v.push_back(k);
    rep(i,0,v.size()) {
        EXPECT_EQ((i==0) ? (-INF) : v[i-1], closestLowerStrict(s, v[i]));
    }
}